

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant1.c
# Opt level: O0

void jinit_1pass_quantizer(j_decompress_ptr cinfo)

{
  undefined8 *puVar1;
  long *in_RDI;
  j_decompress_ptr unaff_retaddr;
  my_cquantize_ptr cquantize;
  j_decompress_ptr in_stack_00000020;
  
  puVar1 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x98);
  in_RDI[0x4e] = (long)puVar1;
  *puVar1 = start_pass_1_quant;
  puVar1[2] = finish_pass_1_quant;
  puVar1[3] = new_color_map_1_quant;
  puVar1[0xe] = 0;
  puVar1[10] = 0;
  if (4 < (int)in_RDI[0x12]) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x37;
    *(undefined4 *)(*in_RDI + 0x2c) = 4;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (0x100 < (int)in_RDI[0xf]) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x39;
    *(undefined4 *)(*in_RDI + 0x2c) = 0x100;
    (**(code **)*in_RDI)(in_RDI);
  }
  create_colormap(in_stack_00000020);
  create_colorindex(cinfo);
  if ((int)in_RDI[0xe] == 2) {
    alloc_fs_workspace(unaff_retaddr);
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_1pass_quantizer(j_decompress_ptr cinfo)
{
  my_cquantize_ptr cquantize;

  cquantize = (my_cquantize_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(my_cquantizer));
  cinfo->cquantize = (struct jpeg_color_quantizer *)cquantize;
  cquantize->pub.start_pass = start_pass_1_quant;
  cquantize->pub.finish_pass = finish_pass_1_quant;
  cquantize->pub.new_color_map = new_color_map_1_quant;
  cquantize->fserrors[0] = NULL; /* Flag FS workspace not allocated */
  cquantize->odither[0] = NULL; /* Also flag odither arrays not allocated */

  /* Make sure my internal arrays won't overflow */
  if (cinfo->out_color_components > MAX_Q_COMPS)
    ERREXIT1(cinfo, JERR_QUANT_COMPONENTS, MAX_Q_COMPS);
  /* Make sure colormap indexes can be represented by JSAMPLEs */
  if (cinfo->desired_number_of_colors > (MAXJSAMPLE + 1))
    ERREXIT1(cinfo, JERR_QUANT_MANY_COLORS, MAXJSAMPLE + 1);

  /* Create the colormap and color index table. */
  create_colormap(cinfo);
  create_colorindex(cinfo);

  /* Allocate Floyd-Steinberg workspace now if requested.
   * We do this now since it may affect the memory manager's space
   * calculations.  If the user changes to FS dither mode in a later pass, we
   * will allocate the space then, and will possibly overrun the
   * max_memory_to_use setting.
   */
  if (cinfo->dither_mode == JDITHER_FS)
    alloc_fs_workspace(cinfo);
}